

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.cpp
# Opt level: O0

void __thiscall OpenMD::StuntDouble::zeroForcesAndTorques(StuntDouble *this)

{
  uint uVar1;
  Snapshot *pSVar2;
  long in_RDI;
  int sl;
  Vector3d *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  pSVar2 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
  uVar1 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(pSVar2->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)));
  if ((uVar1 & 4) != 0) {
    setFrc((StuntDouble *)CONCAT44(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  }
  if ((uVar1 & 0x20) != 0) {
    setTrq((StuntDouble *)CONCAT44(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  }
  if ((uVar1 & 0x40) != 0) {
    in_stack_ffffffffffffffe8 = (Vector3d *)0x0;
    setParticlePot((StuntDouble *)CONCAT44(uVar1,in_stack_fffffffffffffff0),(RealType *)0x0);
  }
  if ((uVar1 & 0x10000) != 0) {
    setFlucQFrc((StuntDouble *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
                (RealType)in_stack_ffffffffffffffe8);
  }
  if ((uVar1 & 0x1000) != 0) {
    setElectricField((StuntDouble *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffe8);
  }
  if ((uVar1 & 0x20000) != 0) {
    setSitePotential((StuntDouble *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
                     (RealType)in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void StuntDouble::zeroForcesAndTorques() {
    int sl = (snapshotMan_->getCurrentSnapshot()->*storage_).getStorageLayout();

    if (sl & DataStorage::dslForce) setFrc(V3Zero);
    if (sl & DataStorage::dslTorque) setTrq(V3Zero);
    if (sl & DataStorage::dslParticlePot) setParticlePot(0.0);
    if (sl & DataStorage::dslFlucQForce) setFlucQFrc(0.0);
    if (sl & DataStorage::dslElectricField) setElectricField(V3Zero);
    if (sl & DataStorage::dslSitePotential) setSitePotential(0.0);
  }